

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inlined_vector.h
# Opt level: O0

reference __thiscall
absl::lts_20250127::
InlinedVector<absl::lts_20250127::cord_internal::CordRep_*,_2UL,_std::allocator<absl::lts_20250127::cord_internal::CordRep_*>_>
::back(InlinedVector<absl::lts_20250127::cord_internal::CordRep_*,_2UL,_std::allocator<absl::lts_20250127::cord_internal::CordRep_*>_>
       *this)

{
  bool bVar1;
  pointer ppCVar2;
  size_type sVar3;
  anon_class_1_0_00000001 local_11;
  InlinedVector<absl::lts_20250127::cord_internal::CordRep_*,_2UL,_std::allocator<absl::lts_20250127::cord_internal::CordRep_*>_>
  *local_10;
  InlinedVector<absl::lts_20250127::cord_internal::CordRep_*,_2UL,_std::allocator<absl::lts_20250127::cord_internal::CordRep_*>_>
  *this_local;
  
  local_10 = this;
  bVar1 = empty(this);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    back::anon_class_1_0_00000001::operator()(&local_11);
  }
  ppCVar2 = data(this);
  sVar3 = size(this);
  return ppCVar2 + (sVar3 - 1);
}

Assistant:

reference back() ABSL_ATTRIBUTE_LIFETIME_BOUND {
    ABSL_HARDENING_ASSERT(!empty());
    return data()[size() - 1];
  }